

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::ConstantFillFunction<duckdb::hugeint_t>
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  data_ptr_t pdVar1;
  int64_t *piVar2;
  bool bVar3;
  hugeint_t hVar4;
  
  pdVar1 = result->data;
  hVar4 = NumericStats::GetMin<duckdb::hugeint_t>(&(segment->stats).statistics);
  piVar2 = (int64_t *)(pdVar1 + start_idx * 0x10 + 8);
  while (bVar3 = count != 0, count = count - 1, bVar3) {
    piVar2[-1] = hVar4.lower;
    *piVar2 = hVar4.upper;
    piVar2 = piVar2 + 2;
  }
  return;
}

Assistant:

void ConstantFillFunction(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &nstats = segment.stats.statistics;

	auto data = FlatVector::GetData<T>(result);
	auto constant_value = NumericStats::GetMin<T>(nstats);
	for (idx_t i = 0; i < count; i++) {
		data[start_idx + i] = constant_value;
	}
}